

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O3

void anon_unknown.dwarf_56e97::testTiledWithBadAttribute(char *file)

{
  size_t __n;
  char *file_00;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Header *pHVar5;
  long lVar6;
  undefined8 *puVar7;
  long *plVar8;
  int iVar9;
  char *pcVar10;
  MultiPartInputFile *pMVar11;
  int iVar12;
  TiledInputPart tip;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> value;
  TiledInputFile in;
  InputFile sin;
  MultiPartInputFile multiin;
  int local_b8;
  int local_b4;
  undefined1 local_b0 [8];
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> local_a8;
  undefined1 local_88 [16];
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  local_78;
  char *local_48;
  MultiPartInputFile local_40 [16];
  
  iVar2 = Imf_3_2::globalThreadCount();
  local_48 = file;
  Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)local_88,file,iVar2);
  local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  pHVar5 = (Header *)Imf_3_2::TiledInputFile::header();
  doFrameBuffer(&local_a8,pHVar5,(FrameBuffer *)&local_78);
  Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)local_88);
  Imf_3_2::TiledInputFile::header();
  lVar6 = Imf_3_2::Header::tileDescription();
  iVar2 = *(int *)(lVar6 + 8);
  if (iVar2 == 0) {
    local_b8 = 1;
    local_b4 = 1;
LAB_0012e1d1:
    iVar2 = 0;
    do {
      if (0 < local_b4) {
        iVar9 = 0;
        do {
          iVar12 = (int)local_88;
          iVar3 = Imf_3_2::TiledInputFile::numXTiles(iVar12);
          iVar4 = Imf_3_2::TiledInputFile::numYTiles(iVar12);
          Imf_3_2::TiledInputFile::readTiles(iVar12,0,iVar3 + -1,0,iVar4 + -1,iVar2);
          iVar9 = iVar9 + 1;
        } while (local_b4 != iVar9);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != local_b8);
  }
  else if (iVar2 == 1) {
    local_b8 = Imf_3_2::TiledInputFile::numXLevels();
    local_b4 = 1;
LAB_0012e1b5:
    if (0 < local_b8) goto LAB_0012e1d1;
  }
  else {
    if (iVar2 == 2) {
      local_b8 = Imf_3_2::TiledInputFile::numXLevels();
      local_b4 = Imf_3_2::TiledInputFile::numYLevels();
      goto LAB_0012e1b5;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid tile mode ",0x12);
    plVar8 = (long *)std::ostream::operator<<(&std::cerr,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree(&local_78);
  if (local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_40,local_48,iVar2,true);
  Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)local_b0,local_40,0);
  local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  pHVar5 = (Header *)Imf_3_2::TiledInputPart::header();
  doFrameBuffer(&local_a8,pHVar5,(FrameBuffer *)&local_78);
  Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)local_b0);
  Imf_3_2::TiledInputPart::header();
  cVar1 = Imf_3_2::Header::hasType();
  if (cVar1 != '\0') {
    Imf_3_2::TiledInputPart::header();
    puVar7 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    __n = puVar7[1];
    if ((__n != _DAT_001efe28) ||
       ((__n != 0 && (iVar2 = bcmp((void *)*puVar7,Imf_3_2::TILEDIMAGE_abi_cxx11_,__n), iVar2 != 0))
       )) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"tiled image/part didn\'t have tiledimage type\n",0x2d);
    }
  }
  Imf_3_2::TiledInputPart::header();
  lVar6 = Imf_3_2::Header::tileDescription();
  iVar2 = *(int *)(lVar6 + 8);
  if (iVar2 == 0) {
    local_b8 = 1;
    local_b4 = 1;
  }
  else {
    if (iVar2 == 1) {
      local_b8 = Imf_3_2::TiledInputPart::numXLevels();
      local_b4 = 1;
    }
    else {
      if (iVar2 != 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Invalid tile mode ",0x12);
        plVar8 = (long *)std::ostream::operator<<(&std::cerr,iVar2);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
        goto LAB_0012e4d1;
      }
      local_b8 = Imf_3_2::TiledInputPart::numXLevels();
      local_b4 = Imf_3_2::TiledInputPart::numYLevels();
    }
    if (local_b8 < 1) goto LAB_0012e4d1;
  }
  iVar2 = 0;
  do {
    if (0 < local_b4) {
      iVar9 = 0;
      do {
        iVar12 = (int)local_b0;
        iVar3 = Imf_3_2::TiledInputPart::numXTiles(iVar12);
        iVar4 = Imf_3_2::TiledInputPart::numYTiles(iVar12);
        Imf_3_2::TiledInputPart::readTiles(iVar12,0,iVar3 + -1,0,iVar4 + -1,iVar2);
        iVar9 = iVar9 + 1;
      } while (local_b4 != iVar9);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != local_b8);
LAB_0012e4d1:
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree(&local_78);
  if (local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  iVar2 = Imf_3_2::globalThreadCount();
  file_00 = local_48;
  pcVar10 = local_48;
  Imf_3_2::InputFile::InputFile((InputFile *)&local_78,local_48,iVar2);
  readScanlineThing<Imf_3_2::InputFile>((InputFile *)&local_78,SUB81(pcVar10,0));
  Imf_3_2::InputFile::~InputFile((InputFile *)&local_78);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_40);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&local_78,file_00,iVar2,true);
  pMVar11 = (MultiPartInputFile *)&local_78;
  Imf_3_2::InputPart::InputPart((InputPart *)&local_a8,pMVar11,0);
  readScanlineThing<Imf_3_2::InputPart>((InputPart *)&local_a8,SUB81(pMVar11,0));
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&local_78);
  checkDeepTypesFailToLoad(file_00);
  Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)local_88);
  return;
}

Assistant:

void
testTiledWithBadAttribute (const char* file)
{
    // it's a tiled file, so it should read as a file
    TiledInputFile in (file);
    readTiledThing (in, false);

    {
        // it should also read using the multipart API (and have its attribute fixed)
        MultiPartInputFile multiin (file);
        TiledInputPart     tip (multiin, 0);
        readTiledThing (tip, true);

        // it should also read using the regular file API as a scanline file
        InputFile sin (file);
        readScanlineThing (sin, false);
    }
    {
        // it should also read using the multipart API as a scanline file
        MultiPartInputFile multiin (file);

        InputPart ip (multiin, 0);
        readScanlineThing (ip, false);
    }

    checkDeepTypesFailToLoad (file);
}